

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

void kwsysProcessCleanup(cmsysProcess *cp,int error)

{
  cmsysProcess **__ptr;
  kwsysProcessInstances kVar1;
  __pid_t _Var2;
  int iVar3;
  int *piVar4;
  char *__src;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  int status;
  undefined1 local_28 [8];
  cmsysProcess **ppcStack_20;
  
  if (error != 0) {
    if (cp->ErrorMessage[0] == '\0') {
      piVar4 = __errno_location();
      __src = strerror(*piVar4);
      strncpy(cp->ErrorMessage,__src,0x400);
    }
    cp->State = 1;
    if ((cp->ForkPIDs != (pid_t *)0x0) && (0 < cp->NumberOfCommands)) {
      lVar8 = 0;
      do {
        if (cp->ForkPIDs[lVar8] != 0) {
          kwsysProcessKill(cp->ForkPIDs[lVar8]);
          do {
            _Var2 = waitpid(cp->ForkPIDs[lVar8],(int *)local_28,0);
            if (-1 < _Var2) break;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < cp->NumberOfCommands);
    }
    if (cp->RealWorkingDirectory != (char *)0x0) {
      do {
        iVar3 = chdir(cp->RealWorkingDirectory);
        if (-1 < iVar3) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
    }
  }
  if (cp->OptionDetach == 0) {
    _local_28 = kwsysProcesses;
    kVar1 = _local_28;
    local_28._0_4_ = kwsysProcesses.Count;
    uVar5 = (ulong)(int)local_28._0_4_;
    if (0 < (long)uVar5) {
      ppcStack_20 = kwsysProcesses.Processes;
      __ptr = ppcStack_20;
      if (*ppcStack_20 == cp) {
        bVar9 = true;
        uVar6 = 0;
      }
      else {
        uVar7 = 0;
        do {
          if (uVar5 - 1 == uVar7) goto LAB_00104a89;
          uVar6 = uVar7 + 1;
          lVar8 = uVar7 + 1;
          uVar7 = uVar6;
        } while (ppcStack_20[lVar8] != cp);
        bVar9 = uVar6 < uVar5;
      }
      if (bVar9) {
        local_28._0_4_ = local_28._0_4_ - 1;
        stack0xffffffffffffffdc = kwsysProcesses._4_12_;
        if ((int)uVar6 < (int)local_28._0_4_) {
          do {
            __ptr[uVar6] = __ptr[uVar6 + 1];
            uVar6 = uVar6 + 1;
          } while ((uint)local_28._0_4_ != uVar6);
        }
        if (local_28._0_4_ == 0) {
          do {
            iVar3 = sigaction(0x11,(sigaction *)&kwsysProcessesOldSigChldAction,(sigaction *)0x0);
            if (-1 < iVar3) break;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
          do {
            iVar3 = sigaction(2,(sigaction *)&kwsysProcessesOldSigIntAction,(sigaction *)0x0);
            if (-1 < iVar3) break;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
          do {
            iVar3 = sigaction(0xf,(sigaction *)&kwsysProcessesOldSigTermAction,(sigaction *)0x0);
            if (-1 < iVar3) break;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
          local_28._4_4_ = 0;
          free(__ptr);
          ppcStack_20 = (cmsysProcess **)0x0;
        }
        kwsysProcessesUpdate((kwsysProcessInstances *)local_28);
        kVar1 = _local_28;
      }
    }
LAB_00104a89:
    _local_28 = kVar1;
    kwsysProcessCleanupDescriptor(&cp->SignalPipe);
  }
  if (cp->ForkPIDs != (pid_t *)0x0) {
    free(cp->ForkPIDs);
    cp->ForkPIDs = (pid_t *)0x0;
  }
  if (cp->RealWorkingDirectory != (char *)0x0) {
    free(cp->RealWorkingDirectory);
    cp->RealWorkingDirectory = (char *)0x0;
  }
  lVar8 = 0;
  do {
    kwsysProcessCleanupDescriptor((int *)((long)cp->PipeReadEnds + lVar8));
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0xc);
  lVar8 = 0;
  do {
    kwsysProcessCleanupDescriptor((int *)((long)cp->PipeChildStd + lVar8));
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0xc);
  return;
}

Assistant:

static void kwsysProcessCleanup(kwsysProcess* cp, int error)
{
  int i;

  if(error)
    {
    /* We are cleaning up due to an error.  Report the error message
       if one has not been provided already.  */
    if(cp->ErrorMessage[0] == 0)
      {
      strncpy(cp->ErrorMessage, strerror(errno), KWSYSPE_PIPE_BUFFER_SIZE);
      }

    /* Set the error state.  */
    cp->State = kwsysProcess_State_Error;

    /* Kill any children already started.  */
    if(cp->ForkPIDs)
      {
      int status;
      for(i=0; i < cp->NumberOfCommands; ++i)
        {
        if(cp->ForkPIDs[i])
          {
          /* Kill the child.  */
          kwsysProcessKill(cp->ForkPIDs[i]);

          /* Reap the child.  Keep trying until the call is not
             interrupted.  */
          while((waitpid(cp->ForkPIDs[i], &status, 0) < 0) &&
                (errno == EINTR));
          }
        }
      }

    /* Restore the working directory.  */
    if(cp->RealWorkingDirectory)
      {
      while((chdir(cp->RealWorkingDirectory) < 0) && (errno == EINTR));
      }
    }

  /* If not creating a detached child, remove this object from the
     global set of process objects that wish to be notified when a
     child exits.  */
  if(!cp->OptionDetach)
    {
    kwsysProcessesRemove(cp);
    }

  /* Free memory.  */
  if(cp->ForkPIDs)
    {
    kwsysProcessVolatileFree(cp->ForkPIDs);
    cp->ForkPIDs = 0;
    }
  if(cp->RealWorkingDirectory)
    {
    free(cp->RealWorkingDirectory);
    cp->RealWorkingDirectory = 0;
    }

  /* Close pipe handles.  */
  for(i=0; i < KWSYSPE_PIPE_COUNT; ++i)
    {
    kwsysProcessCleanupDescriptor(&cp->PipeReadEnds[i]);
    }
  for(i=0; i < 3; ++i)
    {
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[i]);
    }
}